

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int windowExprGtZero(Parse *pParse,Expr *pExpr)

{
  i64 iVar1;
  sqlite3_value *v;
  uint uVar2;
  ValueNewStat4Ctx *in_R9;
  long in_FS_OFFSET;
  sqlite3_value *pVal;
  sqlite3_value *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (Mem *)0x0;
  if (pExpr != (Expr *)0x0) {
    valueFromExpr((sqlite3 *)pParse,pExpr,*(u8 *)((long)&pParse->pIdxEpr + 4),'C',&local_20,in_R9);
    v = local_20;
    if (local_20 != (Mem *)0x0) {
      iVar1 = sqlite3VdbeIntValue(local_20);
      uVar2 = (uint)(0 < (int)iVar1);
      goto LAB_001a06b0;
    }
  }
  v = (sqlite3_value *)0x0;
  uVar2 = 0;
LAB_001a06b0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    sqlite3ValueFree(v);
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int windowExprGtZero(Parse *pParse, Expr *pExpr){
  int ret = 0;
  sqlite3 *db = pParse->db;
  sqlite3_value *pVal = 0;
  sqlite3ValueFromExpr(db, pExpr, db->enc, SQLITE_AFF_NUMERIC, &pVal);
  if( pVal && sqlite3_value_int(pVal)>0 ){
    ret = 1;
  }
  sqlite3ValueFree(pVal);
  return ret;
}